

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_add.c
# Opt level: O2

int BN_uadd(BIGNUM *r,BIGNUM *a,BIGNUM *b)

{
  int num;
  ulong *ap;
  ulong *rp;
  int iVar1;
  BIGNUM *pBVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  BIGNUM *pBVar6;
  
  pBVar6 = a;
  if (a->top < b->top) {
    pBVar6 = b;
    b = a;
  }
  iVar1 = pBVar6->top;
  num = b->top;
  pBVar2 = bn_wexpand((BIGNUM *)r,iVar1 + 1);
  if (pBVar2 == (BIGNUM *)0x0) {
    iVar1 = 0;
  }
  else {
    r->top = iVar1;
    ap = pBVar6->d;
    rp = r->d;
    uVar3 = bn_add_words(rp,ap,b->d,num);
    for (lVar4 = 0; iVar1 - num != (int)lVar4; lVar4 = lVar4 + 1) {
      uVar5 = ap[num + lVar4] + uVar3;
      rp[num + lVar4] = uVar5;
      uVar3 = (ulong)((uint)uVar3 & (uint)(uVar5 == 0));
    }
    rp[num + lVar4] = uVar3;
    r->top = r->top + (uint)uVar3;
    r->neg = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int BN_uadd(BIGNUM *r, const BIGNUM *a, const BIGNUM *b)
{
    int max, min, dif;
    const BN_ULONG *ap, *bp;
    BN_ULONG *rp, carry, t1, t2;

    bn_check_top(a);
    bn_check_top(b);

    if (a->top < b->top) {
        const BIGNUM *tmp;

        tmp = a;
        a = b;
        b = tmp;
    }
    max = a->top;
    min = b->top;
    dif = max - min;

    if (bn_wexpand(r, max + 1) == NULL)
        return 0;

    r->top = max;

    ap = a->d;
    bp = b->d;
    rp = r->d;

    carry = bn_add_words(rp, ap, bp, min);
    rp += min;
    ap += min;

    while (dif) {
        dif--;
        t1 = *(ap++);
        t2 = (t1 + carry) & BN_MASK2;
        *(rp++) = t2;
        carry &= (t2 == 0);
    }
    *rp = carry;
    r->top += carry;

    r->neg = 0;
    bn_check_top(r);
    return 1;
}